

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

int pageant_add_keyfile(Filename *filename,char *passphrase,char **retstr,_Bool add_encrypted)

{
  ptrlen pl1;
  RSAKey *key;
  _Bool _Var1;
  int type;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  strbuf *buf_o;
  KeyList *kl;
  LoadedFile *lf;
  PageantClientOp *pPVar6;
  ssh2_userkey *ptr;
  char *pcVar7;
  size_t n;
  undefined7 in_register_00000009;
  PageantClientOp *pco;
  long lVar8;
  ssh2_userkey *psVar9;
  bool bVar10;
  ulong uVar11;
  ptrlen pl;
  ptrlen pl2;
  char *error;
  char *comment;
  char *local_60;
  RSAKey *local_58;
  char *local_50;
  char **local_48;
  Filename *local_40;
  char *local_38;
  
  local_60 = (char *)0x0;
  if (passphrases == (tree234 *)0x0) {
    passphrases = newtree234((cmpfn234)0x0);
  }
  *retstr = (char *)0x0;
  type = key_type(filename);
  if (type - 4U < 0xfffffffe) {
    pcVar5 = key_type_to_str(type);
    pcVar5 = dupprintf("Couldn\'t load this key (%s)",pcVar5);
    goto LAB_00114692;
  }
  bVar10 = !add_encrypted;
  local_38 = passphrase;
  if (type == 2 && !bVar10) {
    pcVar5 = dupprintf("Can\'t add SSH-1 keys in encrypted form");
    goto LAB_00114692;
  }
  local_58 = (RSAKey *)CONCAT44(local_58._4_4_,(int)CONCAT71(in_register_00000009,add_encrypted));
  buf_o = strbuf_new();
  if (type == 2) {
    iVar2 = rsa1_loadpub_f(filename,buf_o->binarysink_,(char **)0x0,&local_60);
    uVar3 = 1;
    if (iVar2 == 0) {
LAB_00114727:
      pcVar5 = dupprintf("Couldn\'t load private key (%s)",local_60);
      *retstr = pcVar5;
      goto LAB_0011473d;
    }
  }
  else {
    _Var1 = ppk_loadpub_f(filename,(char **)0x0,buf_o->binarysink_,(char **)0x0,&local_60);
    uVar3 = 2;
    if (!_Var1) goto LAB_00114727;
  }
  kl = pageant_get_keylist(uVar3);
  if (kl != (KeyList *)0x0) {
    if (kl->broken != false) {
      pcVar5 = dupstr("Received broken key list from agent");
      *retstr = pcVar5;
      keylist_free(kl);
LAB_0011473d:
      strbuf_free(buf_o);
      return 1;
    }
    local_48 = retstr;
    local_40 = filename;
    if (kl->nkeys != 0) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        pl1.ptr = buf_o->u;
        pl1.len = buf_o->len;
        pl2.len = *(size_t *)((long)&(kl->keys->blob).len + lVar8);
        pl2.ptr = *(void **)((long)&(kl->keys->blob).ptr + lVar8);
        _Var1 = ptrlen_eq_ptrlen(pl1,pl2);
        if ((_Var1) &&
           ((uVar3 = *(uint *)((long)&kl->keys->flags + lVar8), (uVar3 & 2) == 0 && bVar10 ||
            ((uVar3 & 1) != 0 && !bVar10)))) {
          keylist_free(kl);
          strbuf_free(buf_o);
          return 0;
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x28;
      } while (uVar11 < kl->nkeys);
    }
    keylist_free(kl);
    filename = local_40;
    retstr = local_48;
  }
  strbuf_free(buf_o);
  if ((char)local_58 == '\0') {
    local_60 = (char *)0x0;
    local_48 = retstr;
    if (type == 2) {
      _Var1 = rsa1_encrypted_f(filename,&local_50);
      local_58 = (RSAKey *)safemalloc(1,0x48,0);
    }
    else {
      _Var1 = ppk_encrypted_f(filename,&local_50);
      local_58 = (RSAKey *)0x0;
    }
    iVar2 = 0;
    ptr = (ssh2_userkey *)0x0;
    do {
      pcVar5 = "";
      if (_Var1 != false) {
        if (local_38 == (char *)0x0) {
          pcVar5 = (char *)index234(passphrases,iVar2);
          if (pcVar5 == (char *)0x0) goto LAB_00114934;
        }
        else {
          pcVar5 = local_38;
          if (iVar2 != 0) {
LAB_00114934:
            *local_48 = local_50;
            safefree(local_58);
            return 2;
          }
        }
      }
      if (type == 2) {
        iVar4 = rsa1_load_f(filename,local_58,pcVar5,&local_60);
        if (iVar4 == 1) goto LAB_00114961;
        psVar9 = ptr;
        if (iVar4 == 0) goto LAB_00114a1f;
      }
      else {
        ptr = ppk_load_f(filename,pcVar5,&local_60);
        psVar9 = &ssh2_wrong_passphrase;
        if (ptr != &ssh2_wrong_passphrase) {
          if (ptr != (ssh2_userkey *)0x0) {
LAB_00114961:
            pcVar5 = dupstr(pcVar5);
            pcVar7 = (char *)addpos234(passphrases,pcVar5,0);
            if (pcVar7 != pcVar5) {
              n = strlen(pcVar5);
              smemclr(pcVar5,n);
              safefree(pcVar5);
            }
            if (local_50 != (char *)0x0) {
              safefree(local_50);
            }
            pPVar6 = pageant_client_op_new();
            retstr = local_48;
            if (type == 2) {
              BinarySink_put_byte(pPVar6->binarysink_,'\a');
              key = local_58;
              rsa_ssh1_private_blob_agent(pPVar6->binarysink_,local_58);
              BinarySink_put_stringz(pPVar6->binarysink_,key->comment);
              uVar3 = pageant_client_op_query(pPVar6);
              pageant_client_op_free(pPVar6);
              freersakey(key);
              safefree(key);
            }
            else {
              BinarySink_put_byte(pPVar6->binarysink_,'\x11');
              BinarySink_put_stringz(pPVar6->binarysink_,ptr->key->vt->ssh_id);
              (*ptr->key->vt->openssh_blob)(ptr->key,pPVar6->binarysink_);
              BinarySink_put_stringz(pPVar6->binarysink_,ptr->comment);
              uVar3 = pageant_client_op_query(pPVar6);
              pageant_client_op_free(pPVar6);
              safefree(ptr->comment);
              (*ptr->key->vt->freekey)(ptr->key);
              safefree(ptr);
            }
            if (uVar3 == 6) {
              return 0;
            }
            goto LAB_00114aea;
          }
LAB_00114a1f:
          pcVar5 = dupstr(local_60);
          *local_48 = pcVar5;
          safefree(local_58);
          if (local_50 != (char *)0x0) {
            safefree(local_50);
            return 1;
          }
          return 1;
        }
      }
      iVar2 = iVar2 + 1;
      ptr = psVar9;
    } while( true );
  }
  lf = lf_load_keyfile(filename,&local_50);
  if (lf != (LoadedFile *)0x0) {
    pPVar6 = pageant_client_op_new();
    BinarySink_put_byte(pPVar6->binarysink_,'\x1b');
    pl.len = 0x23;
    pl.ptr = "add-ppk@putty.projects.tartarus.org";
    BinarySink_put_stringpl(pPVar6->binarysink_,pl);
    BinarySink_put_string(pPVar6->binarysink_,lf->data,lf->len);
    lf_free(lf);
    uVar3 = pageant_client_op_query(pPVar6);
    pageant_client_op_free(pPVar6);
    if (uVar3 == 5) {
      local_50 = "Agent doesn\'t support adding encrypted keys";
    }
    else {
      if (uVar3 == 6) {
        return 0;
      }
LAB_00114aea:
      local_50 = "The already running agent refused to add the key.";
    }
  }
  pcVar5 = dupstr(local_50);
LAB_00114692:
  *retstr = pcVar5;
  return 1;
}

Assistant:

int pageant_add_keyfile(Filename *filename, const char *passphrase,
                        char **retstr, bool add_encrypted)
{
    RSAKey *rkey = NULL;
    ssh2_userkey *skey = NULL;
    bool needs_pass;
    int ret;
    int attempts;
    char *comment;
    const char *this_passphrase;
    const char *error = NULL;
    int type;

    if (!passphrases) {
        passphrases = newtree234(NULL);
    }

    *retstr = NULL;

    type = key_type(filename);
    if (type != SSH_KEYTYPE_SSH1 && type != SSH_KEYTYPE_SSH2) {
        *retstr = dupprintf("Couldn't load this key (%s)",
                            key_type_to_str(type));
        return PAGEANT_ACTION_FAILURE;
    }

    if (add_encrypted && type == SSH_KEYTYPE_SSH1) {
        *retstr = dupprintf("Can't add SSH-1 keys in encrypted form");
        return PAGEANT_ACTION_FAILURE;
    }

    /*
     * See if the key is already loaded (in the primary Pageant,
     * which may or may not be us).
     */
    {
        strbuf *blob = strbuf_new();
        KeyList *kl;

        if (type == SSH_KEYTYPE_SSH1) {
            if (!rsa1_loadpub_f(filename, BinarySink_UPCAST(blob),
                                NULL, &error)) {
                *retstr = dupprintf("Couldn't load private key (%s)", error);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }
            kl = pageant_get_keylist(1);
        } else {
            if (!ppk_loadpub_f(filename, NULL, BinarySink_UPCAST(blob),
                               NULL, &error)) {
                *retstr = dupprintf("Couldn't load private key (%s)", error);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }
            kl = pageant_get_keylist(2);
        }

        if (kl) {
            if (kl->broken) {
                *retstr = dupstr("Received broken key list from agent");
                keylist_free(kl);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }

            for (size_t i = 0; i < kl->nkeys; i++) {
                /*
                 * If the key already exists in the agent, we're done,
                 * except in the following special cases:
                 *
                 * It's encrypted in the agent, and we're being asked
                 * to add it unencrypted, in which case we still want
                 * to upload the unencrypted version to cause the key
                 * to become decrypted.
                 * (Rationale: if you know in advance you're going to
                 * want it, and don't want to be interrupted at an
                 * unpredictable moment to be asked for the
                 * passphrase.)
                 *
                 * The agent only has cleartext, and we're being asked
                 * to add it encrypted, in which case we'll add the
                 * encrypted form.
                 * (Rationale: if you might want to re-encrypt the key
                 * at some future point, but it happened to have been
                 * initially added in cleartext, perhaps by something
                 * other than Pageant.)
                 */
                if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(blob),
                                     kl->keys[i].blob)) {
                    bool have_unencrypted =
                        !(kl->keys[i].flags &
                          LIST_EXTENDED_FLAG_HAS_NO_CLEARTEXT_KEY);
                    bool have_encrypted =
                        (kl->keys[i].flags &
                         LIST_EXTENDED_FLAG_HAS_ENCRYPTED_KEY_FILE);
                    if ((have_unencrypted && !add_encrypted)
                        || (have_encrypted && add_encrypted)) {
                        /* Key is already present in the desired form;
                         * we can now leave. */
                        keylist_free(kl);
                        strbuf_free(blob);
                        return PAGEANT_ACTION_OK;
                    }
                }
            }

            keylist_free(kl);
        }

        strbuf_free(blob);
    }

    if (add_encrypted) {
        const char *load_error;
        LoadedFile *lf = lf_load_keyfile(filename, &load_error);
        if (!lf) {
            *retstr = dupstr(load_error);
            return PAGEANT_ACTION_FAILURE;
        }

        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH2_AGENTC_EXTENSION);
        put_stringpl(pco, extension_names[EXT_ADD_PPK]);
        put_string(pco, lf->data, lf->len);

        lf_free(lf);

        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        if (reply != SSH_AGENT_SUCCESS) {
            if (reply == SSH_AGENT_FAILURE) {
                /* The agent didn't understand the protocol extension
                 * at all. */
                *retstr = dupstr("Agent doesn't support adding "
                                 "encrypted keys");
            } else {
                *retstr = dupstr("The already running agent "
                                 "refused to add the key.");
            }
            return PAGEANT_ACTION_FAILURE;
        }

        return PAGEANT_ACTION_OK;
    }

    error = NULL;
    if (type == SSH_KEYTYPE_SSH1)
        needs_pass = rsa1_encrypted_f(filename, &comment);
    else
        needs_pass = ppk_encrypted_f(filename, &comment);
    attempts = 0;
    if (type == SSH_KEYTYPE_SSH1)
        rkey = snew(RSAKey);

    /*
     * Loop round repeatedly trying to load the key, until we either
     * succeed, fail for some serious reason, or run out of
     * passphrases to try.
     */
    while (1) {
        if (needs_pass) {

            /*
             * If we've been given a passphrase on input, try using
             * it. Otherwise, try one from our tree234 of previously
             * useful passphrases.
             */
            if (passphrase) {
                this_passphrase = (attempts == 0 ? passphrase : NULL);
            } else {
                this_passphrase = (const char *)index234(passphrases, attempts);
            }

            if (!this_passphrase) {
                /*
                 * Run out of passphrases to try.
                 */
                *retstr = comment;
                sfree(rkey);
                return PAGEANT_ACTION_NEED_PP;
            }
        } else
            this_passphrase = "";

        if (type == SSH_KEYTYPE_SSH1)
            ret = rsa1_load_f(filename, rkey, this_passphrase, &error);
        else {
            skey = ppk_load_f(filename, this_passphrase, &error);
            if (skey == SSH2_WRONG_PASSPHRASE)
                ret = -1;
            else if (!skey)
                ret = 0;
            else
                ret = 1;
        }

        if (ret == 0) {
            /*
             * Failed to load the key file, for some reason other than
             * a bad passphrase.
             */
            *retstr = dupstr(error);
            sfree(rkey);
            if (comment)
                sfree(comment);
            return PAGEANT_ACTION_FAILURE;
        } else if (ret == 1) {
            /*
             * Successfully loaded the key file.
             */
            break;
        } else {
            /*
             * Passphrase wasn't right; go round again.
             */
            attempts++;
        }
    }

    /*
     * If we get here, we've successfully loaded the key into
     * rkey/skey, but not yet added it to the agent.
     */

    /*
     * If the key was successfully decrypted, save the passphrase for
     * use with other keys we try to load.
     */
    {
        char *pp_copy = dupstr(this_passphrase);
        if (addpos234(passphrases, pp_copy, 0) != pp_copy) {
            /* No need; it was already there. */
            smemclr(pp_copy, strlen(pp_copy));
            sfree(pp_copy);
        }
    }

    if (comment)
        sfree(comment);

    if (type == SSH_KEYTYPE_SSH1) {
        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH1_AGENTC_ADD_RSA_IDENTITY);
        rsa_ssh1_private_blob_agent(BinarySink_UPCAST(pco), rkey);
        put_stringz(pco, rkey->comment);
        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        freersakey(rkey);
        sfree(rkey);

        if (reply != SSH_AGENT_SUCCESS) {
            *retstr = dupstr("The already running agent "
                             "refused to add the key.");
            return PAGEANT_ACTION_FAILURE;
        }
    } else {
        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH2_AGENTC_ADD_IDENTITY);
        put_stringz(pco, ssh_key_ssh_id(skey->key));
        ssh_key_openssh_blob(skey->key, BinarySink_UPCAST(pco));
        put_stringz(pco, skey->comment);
        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        sfree(skey->comment);
        ssh_key_free(skey->key);
        sfree(skey);

        if (reply != SSH_AGENT_SUCCESS) {
            *retstr = dupstr("The already running agent "
                             "refused to add the key.");
            return PAGEANT_ACTION_FAILURE;
        }
    }
    return PAGEANT_ACTION_OK;
}